

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rom2snsf.cpp
# Opt level: O3

void usage(char *progname)

{
  printf("%s %s\n","rom2snsf","[2017-08-11]");
  printf("<%s>\n","http://github.com/loveemu/rom2snsf");
  putchar(10);
  puts("Usage");
  puts("-----");
  putchar(10);
  printf("Syntax: `%s (options) [SNES ROM files]`\n",progname);
  putchar(10);
  puts("### Options");
  putchar(10);
  puts("`--help`");
  puts("  : Show help");
  putchar(10);
  puts("`-o [output.snsf]`");
  puts("  : Specify output filename");
  putchar(10);
  puts("`--load [offset]`");
  puts("  : Load offset of SNES executable");
  putchar(10);
  puts("`--lib [libname.snsflib]`");
  puts("  : Specify snsflib library name");
  putchar(10);
  puts("`--psfby [name]` (aka. `--snsfby`)");
  puts("  : Set creator name of SNSF");
  putchar(10);
  return;
}

Assistant:

static void usage(const char * progname)
{
	printf("%s %s\n", APP_NAME, APP_VER);
	printf("<%s>\n", APP_URL);
	printf("\n");
	printf("Usage\n");
	printf("-----\n");
	printf("\n");
	printf("Syntax: `%s (options) [SNES ROM files]`\n", progname);
	printf("\n");

	printf("### Options\n");
	printf("\n");
	printf("`--help`\n");
	printf("  : Show help\n");
	printf("\n");
	printf("`-o [output.snsf]`\n");
	printf("  : Specify output filename\n");
	printf("\n");
	printf("`--load [offset]`\n");
	printf("  : Load offset of SNES executable\n");
	printf("\n");
	printf("`--lib [libname.snsflib]`\n");
	printf("  : Specify snsflib library name\n");
	printf("\n");
	printf("`--psfby [name]` (aka. `--snsfby`)\n");
	printf("  : Set creator name of SNSF\n");
	printf("\n");
}